

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void setSubscriptionSettings
               (UA_Server *server,UA_Subscription *subscription,
               UA_Double requestedPublishingInterval,UA_UInt32 requestedLifetimeCount,
               UA_UInt32 requestedMaxKeepAliveCount,UA_UInt32 maxNotificationsPerPublish,
               UA_Byte priority)

{
  UA_Double *pUVar1;
  UA_StatusCode UVar2;
  uint local_a0;
  uint local_98;
  uint local_94;
  uint local_78;
  uint local_70;
  uint local_6c;
  UA_StatusCode retval;
  UA_Byte priority_local;
  UA_UInt32 maxNotificationsPerPublish_local;
  UA_UInt32 requestedMaxKeepAliveCount_local;
  UA_UInt32 requestedLifetimeCount_local;
  UA_Double requestedPublishingInterval_local;
  UA_Subscription *subscription_local;
  UA_Server *server_local;
  
  UVar2 = Subscription_unregisterPublishJob(server,subscription);
  if (UVar2 != 0) {
    if (subscription->session->channel == (UA_SecureChannel *)0x0) {
      local_70 = 0;
    }
    else {
      if (subscription->session->channel->connection == (UA_Connection *)0x0) {
        local_6c = 0;
      }
      else {
        local_6c = subscription->session->channel->connection->sockfd;
      }
      local_70 = local_6c;
    }
    if (subscription->session->channel == (UA_SecureChannel *)0x0) {
      local_78 = 0;
    }
    else {
      local_78 = (subscription->session->channel->securityToken).channelId;
    }
    UA_LOG_DEBUG((server->config).logger,UA_LOGCATEGORY_SESSION,
                 "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | Could not unregister publish job with error code 0x%08x"
                 ,(ulong)local_70,(ulong)local_78,
                 (ulong)(subscription->session->sessionId).identifier.numeric,
                 (uint)(subscription->session->sessionId).identifier.guid.data2,
                 (uint)(subscription->session->sessionId).identifier.guid.data3,
                 (uint)(subscription->session->sessionId).identifier.guid.data4[0],
                 (uint)(subscription->session->sessionId).identifier.guid.data4[1],
                 (uint)(subscription->session->sessionId).identifier.guid.data4[2],
                 (uint)(subscription->session->sessionId).identifier.guid.data4[3],
                 (uint)(subscription->session->sessionId).identifier.guid.data4[4],
                 (uint)(subscription->session->sessionId).identifier.guid.data4[5],
                 (uint)(subscription->session->sessionId).identifier.guid.data4[6],
                 (uint)(subscription->session->sessionId).identifier.guid.data4[7],
                 subscription->subscriptionID,UVar2);
  }
  subscription->publishingInterval = requestedPublishingInterval;
  pUVar1 = &(server->config).publishingIntervalLimits.max;
  if (requestedPublishingInterval < *pUVar1 || requestedPublishingInterval == *pUVar1) {
    if ((server->config).publishingIntervalLimits.min <= requestedPublishingInterval) {
      subscription->publishingInterval = requestedPublishingInterval;
    }
    else {
      subscription->publishingInterval = (server->config).publishingIntervalLimits.min;
    }
  }
  else {
    subscription->publishingInterval = (server->config).publishingIntervalLimits.max;
  }
  if (NAN(requestedPublishingInterval)) {
    subscription->publishingInterval = (server->config).publishingIntervalLimits.min;
  }
  if ((server->config).keepAliveCountLimits.max < requestedMaxKeepAliveCount) {
    subscription->maxKeepAliveCount = (server->config).keepAliveCountLimits.max;
  }
  else if (requestedMaxKeepAliveCount < (server->config).keepAliveCountLimits.min) {
    subscription->maxKeepAliveCount = (server->config).keepAliveCountLimits.min;
  }
  else {
    subscription->maxKeepAliveCount = requestedMaxKeepAliveCount;
  }
  if ((server->config).lifeTimeCountLimits.max < requestedLifetimeCount) {
    subscription->lifeTimeCount = (server->config).lifeTimeCountLimits.max;
  }
  else if (requestedLifetimeCount < (server->config).lifeTimeCountLimits.min) {
    subscription->lifeTimeCount = (server->config).lifeTimeCountLimits.min;
  }
  else {
    subscription->lifeTimeCount = requestedLifetimeCount;
  }
  if (subscription->lifeTimeCount < subscription->maxKeepAliveCount * 3) {
    subscription->lifeTimeCount = subscription->maxKeepAliveCount * 3;
  }
  subscription->notificationsPerPublish = maxNotificationsPerPublish;
  if ((maxNotificationsPerPublish == 0) ||
     ((server->config).maxNotificationsPerPublish < maxNotificationsPerPublish)) {
    subscription->notificationsPerPublish = (server->config).maxNotificationsPerPublish;
  }
  subscription->priority = (uint)priority;
  UVar2 = Subscription_registerPublishJob(server,subscription);
  if (UVar2 != 0) {
    if (subscription->session->channel == (UA_SecureChannel *)0x0) {
      local_98 = 0;
    }
    else {
      if (subscription->session->channel->connection == (UA_Connection *)0x0) {
        local_94 = 0;
      }
      else {
        local_94 = subscription->session->channel->connection->sockfd;
      }
      local_98 = local_94;
    }
    if (subscription->session->channel == (UA_SecureChannel *)0x0) {
      local_a0 = 0;
    }
    else {
      local_a0 = (subscription->session->channel->securityToken).channelId;
    }
    UA_LOG_DEBUG((server->config).logger,UA_LOGCATEGORY_SESSION,
                 "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | Could not register publish job with error code 0x%08x"
                 ,(ulong)local_98,(ulong)local_a0,
                 (ulong)(subscription->session->sessionId).identifier.numeric,
                 (uint)(subscription->session->sessionId).identifier.guid.data2,
                 (uint)(subscription->session->sessionId).identifier.guid.data3,
                 (uint)(subscription->session->sessionId).identifier.guid.data4[0],
                 (uint)(subscription->session->sessionId).identifier.guid.data4[1],
                 (uint)(subscription->session->sessionId).identifier.guid.data4[2],
                 (uint)(subscription->session->sessionId).identifier.guid.data4[3],
                 (uint)(subscription->session->sessionId).identifier.guid.data4[4],
                 (uint)(subscription->session->sessionId).identifier.guid.data4[5],
                 (uint)(subscription->session->sessionId).identifier.guid.data4[6],
                 (uint)(subscription->session->sessionId).identifier.guid.data4[7],
                 subscription->subscriptionID,UVar2);
  }
  return;
}

Assistant:

static void
setSubscriptionSettings(UA_Server *server, UA_Subscription *subscription,
                        UA_Double requestedPublishingInterval,
                        UA_UInt32 requestedLifetimeCount,
                        UA_UInt32 requestedMaxKeepAliveCount,
                        UA_UInt32 maxNotificationsPerPublish, UA_Byte priority) {
    /* deregister the job if required */
    UA_StatusCode retval = Subscription_unregisterPublishJob(server, subscription);
    if(retval != UA_STATUSCODE_GOOD)
        UA_LOG_DEBUG_SESSION(server->config.logger, subscription->session, "Subscription %u | "
                             "Could not unregister publish job with error code 0x%08x",
                             subscription->subscriptionID, retval);

    /* re-parameterize the subscription */
    subscription->publishingInterval = requestedPublishingInterval;
    UA_BOUNDEDVALUE_SETWBOUNDS(server->config.publishingIntervalLimits,
                               requestedPublishingInterval, subscription->publishingInterval);
    /* check for nan*/
    if(requestedPublishingInterval != requestedPublishingInterval)
        subscription->publishingInterval = server->config.publishingIntervalLimits.min;
    UA_BOUNDEDVALUE_SETWBOUNDS(server->config.keepAliveCountLimits,
                               requestedMaxKeepAliveCount, subscription->maxKeepAliveCount);
    UA_BOUNDEDVALUE_SETWBOUNDS(server->config.lifeTimeCountLimits,
                               requestedLifetimeCount, subscription->lifeTimeCount);
    if(subscription->lifeTimeCount < 3 * subscription->maxKeepAliveCount)
        subscription->lifeTimeCount = 3 * subscription->maxKeepAliveCount;
    subscription->notificationsPerPublish = maxNotificationsPerPublish;
    if(maxNotificationsPerPublish == 0 ||
       maxNotificationsPerPublish > server->config.maxNotificationsPerPublish)
        subscription->notificationsPerPublish = server->config.maxNotificationsPerPublish;
    subscription->priority = priority;

    retval = Subscription_registerPublishJob(server, subscription);
    if(retval != UA_STATUSCODE_GOOD)
        UA_LOG_DEBUG_SESSION(server->config.logger, subscription->session, "Subscription %u | "
                             "Could not register publish job with error code 0x%08x",
                             subscription->subscriptionID, retval);
}